

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall maths::Matrix::Matrix(Matrix *this,int rows,int cols)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->rows_ = rows;
  this->cols_ = cols;
  allocSpace(this);
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar2 = uVar3;
  }
  uVar4 = (ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    ppdVar1 = this->p;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      ppdVar1[uVar3][uVar5] = 0.0;
    }
  }
  return;
}

Assistant:

Matrix::Matrix(int rows, int cols) : rows_(rows), cols_(cols)
{
    allocSpace();
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = 0;
        }
    }
}